

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

LClosure * luaF_newLclosure(lua_State *L,int n)

{
  LClosure *pLVar1;
  LClosure *c;
  GCObject *o;
  int n_local;
  lua_State *L_local;
  
  pLVar1 = (LClosure *)luaC_newobj(L,6,(long)((n + -1) * 8 + 0x28));
  pLVar1->p = (Proto *)0x0;
  pLVar1->nupvalues = (lu_byte)n;
  o._4_4_ = n;
  while (o._4_4_ != 0) {
    pLVar1->upvals[o._4_4_ + -1] = (UpVal *)0x0;
    o._4_4_ = o._4_4_ + -1;
  }
  return pLVar1;
}

Assistant:

LClosure *luaF_newLclosure(lua_State *L, int n) {
    GCObject *o = luaC_newobj(L, LUA_TLCL, sizeLclosure(n));
    LClosure *c = gco2lcl(o);
    c->p = NULL;
    c->nupvalues = cast_byte(n);
    while (n--) c->upvals[n] = NULL;
    return c;
}